

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form3_Histogram(HistogramForm3 Histogram)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  bool bVar8;
  uint uVar9;
  ushort uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  Image input;
  uint32_t local_80;
  uint32_t local_7c;
  uint32_t local_78;
  uint32_t local_74;
  undefined1 local_70 [40];
  Image local_48;
  
  bVar6 = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)local_70,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_48,bVar6,0,0,(ImageTemplate<unsigned_char> *)local_70);
  local_70._0_8_ = &PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_70);
  Unit_Test::generateRoi(&local_48,&local_74,&local_78,&local_7c,&local_80);
  (*Histogram)((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,&local_48,local_74,
               local_78,local_7c,local_80);
  if (local_70._8_8_ - local_70._0_8_ == 0x400) {
    uVar1 = *(uint *)(local_70._0_8_ + (ulong)bVar6 * 4);
    uVar9 = 0;
    if (uVar1 == local_80 * local_7c) {
      if (local_70._0_8_ != local_70._8_8_) {
        auVar12 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar17 = ZEXT1664((undefined1  [16])0x0);
        lVar7 = 0;
        auVar14 = vpbroadcastq_avx512f();
        auVar14 = vpsrlq_avx512f(auVar14,2);
        do {
          auVar15 = vpbroadcastq_avx512f();
          auVar16 = vmovdqa64_avx512f(auVar17);
          auVar17 = vporq_avx512f(auVar15,auVar12);
          auVar15 = vporq_avx512f(auVar15,auVar13);
          uVar4 = vpcmpuq_avx512f(auVar15,auVar14,2);
          bVar6 = (byte)uVar4;
          uVar4 = vpcmpuq_avx512f(auVar17,auVar14,2);
          bVar5 = (byte)uVar4;
          uVar10 = CONCAT11(bVar5,bVar6);
          auVar17 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_70._0_8_ + lVar7 * 4));
          auVar15._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar17._4_4_;
          auVar15._0_4_ = (uint)(bVar6 & 1) * auVar17._0_4_;
          auVar15._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar17._8_4_;
          auVar15._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar17._12_4_;
          auVar15._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar17._16_4_;
          auVar15._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar17._20_4_;
          auVar15._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar17._24_4_;
          auVar15._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar17._28_4_;
          auVar15._32_4_ = (uint)(bVar5 & 1) * auVar17._32_4_;
          auVar15._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar17._36_4_;
          auVar15._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar17._40_4_;
          auVar15._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar17._44_4_;
          auVar15._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar17._48_4_;
          auVar15._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar17._52_4_;
          auVar15._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar17._56_4_;
          auVar15._60_4_ = (uint)(bVar5 >> 7) * auVar17._60_4_;
          lVar7 = lVar7 + 0x10;
          auVar17 = vpaddd_avx512f(auVar15,auVar16);
        } while (lVar7 != 0x100);
        auVar12 = vmovdqa32_avx512f(auVar17);
        auVar13._0_4_ = (uint)(bVar6 & 1) * auVar12._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar16._0_4_
        ;
        bVar8 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar13._4_4_ = (uint)bVar8 * auVar12._4_4_ | (uint)!bVar8 * auVar16._4_4_;
        bVar8 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar13._8_4_ = (uint)bVar8 * auVar12._8_4_ | (uint)!bVar8 * auVar16._8_4_;
        bVar8 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar13._12_4_ = (uint)bVar8 * auVar12._12_4_ | (uint)!bVar8 * auVar16._12_4_;
        bVar8 = (bool)((byte)(uVar10 >> 4) & 1);
        auVar13._16_4_ = (uint)bVar8 * auVar12._16_4_ | (uint)!bVar8 * auVar16._16_4_;
        bVar8 = (bool)((byte)(uVar10 >> 5) & 1);
        auVar13._20_4_ = (uint)bVar8 * auVar12._20_4_ | (uint)!bVar8 * auVar16._20_4_;
        bVar8 = (bool)((byte)(uVar10 >> 6) & 1);
        auVar13._24_4_ = (uint)bVar8 * auVar12._24_4_ | (uint)!bVar8 * auVar16._24_4_;
        bVar8 = (bool)((byte)(uVar10 >> 7) & 1);
        auVar13._28_4_ = (uint)bVar8 * auVar12._28_4_ | (uint)!bVar8 * auVar16._28_4_;
        auVar13._32_4_ =
             (uint)(bVar5 & 1) * auVar12._32_4_ | (uint)!(bool)(bVar5 & 1) * auVar16._32_4_;
        bVar8 = (bool)(bVar5 >> 1 & 1);
        auVar13._36_4_ = (uint)bVar8 * auVar12._36_4_ | (uint)!bVar8 * auVar16._36_4_;
        bVar8 = (bool)(bVar5 >> 2 & 1);
        auVar13._40_4_ = (uint)bVar8 * auVar12._40_4_ | (uint)!bVar8 * auVar16._40_4_;
        bVar8 = (bool)(bVar5 >> 3 & 1);
        auVar13._44_4_ = (uint)bVar8 * auVar12._44_4_ | (uint)!bVar8 * auVar16._44_4_;
        bVar8 = (bool)(bVar5 >> 4 & 1);
        auVar13._48_4_ = (uint)bVar8 * auVar12._48_4_ | (uint)!bVar8 * auVar16._48_4_;
        bVar8 = (bool)(bVar5 >> 5 & 1);
        auVar13._52_4_ = (uint)bVar8 * auVar12._52_4_ | (uint)!bVar8 * auVar16._52_4_;
        bVar8 = (bool)(bVar5 >> 6 & 1);
        auVar13._56_4_ = (uint)bVar8 * auVar12._56_4_ | (uint)!bVar8 * auVar16._56_4_;
        auVar13._60_4_ =
             (uint)(bVar5 >> 7) * auVar12._60_4_ | (uint)!(bool)(bVar5 >> 7) * auVar16._60_4_;
        auVar11 = vextracti64x4_avx512f(auVar13,1);
        auVar12 = vpaddd_avx512f(auVar13,ZEXT3264(auVar11));
        auVar2 = vpaddd_avx(auVar12._0_16_,auVar12._16_16_);
        auVar3 = vpshufd_avx(auVar2,0xee);
        auVar2 = vpaddd_avx(auVar2,auVar3);
        auVar3 = vpshufd_avx(auVar2,0x55);
        auVar2 = vpaddd_avx(auVar2,auVar3);
        uVar9 = auVar2._0_4_;
      }
      uVar9 = (uint)(uVar9 == uVar1);
      goto LAB_00150e1a;
    }
  }
  else {
    uVar9 = 0;
LAB_00150e1a:
    bVar8 = SUB41(uVar9,0);
    if ((_func_int **)local_70._0_8_ == (_func_int **)0x0) goto LAB_00150e27;
  }
  bVar8 = SUB41(uVar9,0);
  operator_delete((void *)local_70._0_8_);
LAB_00150e27:
  local_48._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_48);
  return bVar8;
}

Assistant:

bool form3_Histogram(HistogramForm3 Histogram)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const std::vector < uint32_t > histogram = Histogram( input, roiX, roiY, roiWidth, roiHeight );

        return histogram.size() == 256u && histogram[intensity] == roiWidth * roiHeight &&
            std::accumulate( histogram.begin(), histogram.end(), 0u ) == roiWidth * roiHeight;
    }